

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O2

int ldesencode(lua_State *L)

{
  uint uVar1;
  char *pcVar2;
  uint8_t *s;
  ulong uVar3;
  long lVar4;
  ulong size;
  uint8_t tail [8];
  size_t textsz;
  uint32_t SK [32];
  uint8_t tmp [256];
  
  des_key(L,SK);
  textsz = 0;
  pcVar2 = luaL_checklstring(L,2,&textsz);
  size = (textsz & 0xfffffffffffffff8) + 8;
  if (size < 0x101) {
    s = tmp;
  }
  else {
    s = (uint8_t *)lua_newuserdata(L,size);
  }
  for (lVar4 = 0; lVar4 < (int)textsz + -7; lVar4 = lVar4 + 8) {
    des_crypt(SK,(uint8_t *)(pcVar2 + lVar4),s + lVar4);
  }
  uVar1 = (int)textsz - (int)lVar4;
  for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
    if ((long)uVar3 < (long)(int)uVar1) {
      tail[uVar3] = pcVar2[lVar4 + uVar3];
    }
    else if (uVar1 == uVar3) {
      tail[uVar1] = 0x80;
    }
    else {
      tail[uVar3] = '\0';
    }
  }
  des_crypt(SK,tail,s + lVar4);
  lua_pushlstring(L,(char *)s,size);
  return 1;
}

Assistant:

static int
ldesencode(lua_State *L) {
	uint32_t SK[32];
	des_key(L, SK);

	size_t textsz = 0;
	const uint8_t * text = (const uint8_t *)luaL_checklstring(L, 2, &textsz);
	size_t chunksz = (textsz + 8) & ~7;
	uint8_t tmp[SMALL_CHUNK];
	uint8_t *buffer = tmp;
	if (chunksz > SMALL_CHUNK) {
		buffer = lua_newuserdata(L, chunksz);
	}
	int i;
	for (i=0;i<(int)textsz-7;i+=8) {
		des_crypt(SK, text+i, buffer+i);
	}
	int bytes = textsz - i;
	uint8_t tail[8];
	int j;
	for (j=0;j<8;j++) {
		if (j < bytes) {
			tail[j] = text[i+j];
		} else if (j==bytes) {
			tail[j] = 0x80;
		} else {
			tail[j] = 0;
		}
	}
	des_crypt(SK, tail, buffer+i);
	lua_pushlstring(L, (const char *)buffer, chunksz);

	return 1;
}